

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qicohandler.cpp
# Opt level: O3

ssize_t __thiscall QtIcoHandler::write(QtIcoHandler *this,int __fd,void *__buf,size_t __n)

{
  int __fd_00;
  ulong uVar1;
  size_t __n_00;
  undefined4 in_register_00000034;
  long in_FS_OFFSET;
  QArrayDataPointer<QImage> local_38;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  __fd_00 = QImageIOHandler::device();
  local_38.d = (Data *)0x0;
  local_38.ptr = (QImage *)0x0;
  local_38.size = 0;
  QtPrivate::QMovableArrayOps<QImage>::emplace<QImage_const&>
            ((QMovableArrayOps<QImage> *)&local_38,0,(QImage *)CONCAT44(in_register_00000034,__fd));
  QList<QImage>::end((QList<QImage> *)&local_38);
  uVar1 = ICOReader::write(__fd_00,&local_38,__n_00);
  QArrayDataPointer<QImage>::~QArrayDataPointer(&local_38);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return uVar1 & 0xffffffff;
  }
  __stack_chk_fail();
}

Assistant:

bool QtIcoHandler::write(const QImage &image)
{
    QIODevice *device = QImageIOHandler::device();
    QList<QImage> imgs;
    imgs.append(image);
    return ICOReader::write(device, imgs);
}